

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void __thiscall FConsoleAlias::Realias(FConsoleAlias *this,char *command,bool noSave)

{
  ulong uVar1;
  char *pcVar2;
  undefined3 in_register_00000011;
  
  uVar1 = 1;
  if (CONCAT31(in_register_00000011,noSave) == 0) {
    uVar1 = (ulong)(*(int *)(this->m_Command[1].Chars + -0xc) != 0);
  }
  FString::operator=(this->m_Command + uVar1,command);
  pcVar2 = strchr(command,0x25);
  this->bDoSubstitution = pcVar2 != (char *)0x0;
  this->bKill = false;
  return;
}

Assistant:

void FConsoleAlias::Realias (const char *command, bool noSave)
{
	if (!noSave && !m_Command[1].IsEmpty())
	{
		noSave = true;
	}
	m_Command[noSave] = command;

	// If the command contains % characters, assume they are parameter markers
	// for substitution when the command is executed.
	bDoSubstitution = (strchr (command, '%') != NULL);
	bKill = false;
}